

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O3

void gpc_sRGB(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  
  dVar5 = (double)in->r / 65535.0;
  if (dVar5 <= 0.0031308) {
    dVar5 = dVar5 * 12.92;
  }
  else {
    dVar5 = pow(dVar5,0.4166666666666667);
    dVar5 = dVar5 * 1.055 + -0.055;
  }
  dVar5 = floor(dVar5 * 255.0 + 0.5);
  uVar3 = (int)dVar5 & 0xff;
  out->r = uVar3;
  iVar4 = in->r;
  iVar1 = in->g;
  if (iVar1 == iVar4) {
    out->g = uVar3;
    iVar2 = in->b;
    if (iVar2 == iVar1) goto LAB_0010cfed;
  }
  else {
    dVar5 = (double)iVar1 / 65535.0;
    if (dVar5 <= 0.0031308) {
      dVar5 = dVar5 * 12.92;
    }
    else {
      dVar5 = pow(dVar5,0.4166666666666667);
      dVar5 = dVar5 * 1.055 + -0.055;
      iVar4 = in->r;
    }
    dVar5 = floor(dVar5 * 255.0 + 0.5);
    uVar3 = (int)dVar5 & 0xff;
    out->g = uVar3;
    iVar2 = in->b;
    if (iVar2 == iVar4) {
      uVar3 = out->r;
      goto LAB_0010cfed;
    }
    if (iVar2 == in->g) goto LAB_0010cfed;
  }
  dVar5 = (double)iVar2 / 65535.0;
  if (dVar5 <= 0.0031308) {
    dVar5 = dVar5 * 12.92;
  }
  else {
    dVar5 = pow(dVar5,0.4166666666666667);
    dVar5 = dVar5 * 1.055 + -0.055;
  }
  dVar5 = floor(dVar5 * 255.0 + 0.5);
  uVar3 = (int)dVar5 & 0xff;
LAB_0010cfed:
  out->b = uVar3;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_sRGB(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   out->r = isRGB(in->r);

   if (in->g == in->r)
   {
      out->g = out->r;

      if (in->b == in->r)
         out->b = out->r;

      else
         out->b = isRGB(in->b);
   }

   else
   {
      out->g = isRGB(in->g);

      if (in->b == in->r)
         out->b = out->r;

      else if (in->b == in->g)
         out->b = out->g;

      else
         out->b = isRGB(in->b);
   }

   out->a = 255;
}